

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecOrder.c
# Opt level: O2

Vec_Int_t * Gia_PolynReorder(Gia_Man_t *pGia,int fVerbose,int fVeryVerbose)

{
  uint uVar1;
  int iVar2;
  Vec_Int_t *vFadds;
  Vec_Int_t *vHadds;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  int *piVar3;
  Gia_Obj_t *pObj;
  long lVar4;
  uint iObj;
  int iVar5;
  
  vFadds = Gia_ManDetectFullAdders(pGia,fVeryVerbose,(Vec_Int_t **)0x0);
  vHadds = Gia_ManDetectHalfAdders(pGia,fVeryVerbose);
  p = Gia_PolynFindOrder(pGia,vFadds,vHadds,fVerbose,fVeryVerbose);
  p_00 = Vec_IntAlloc(~(pGia->vCos->nSize + pGia->vCis->nSize) + pGia->nObjs);
  p_01 = Vec_IntStart(pGia->nObjs);
  Gia_ManIncrementTravId(pGia);
  for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
    uVar1 = Vec_IntEntry(p,iVar5);
    if ((int)uVar1 < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x13d,"int Abc_Lit2Var2(int)");
    }
    iObj = uVar1 >> 2;
    if ((uVar1 & 3) == 1) {
      piVar3 = Vec_IntEntryP(vHadds,iObj * 2);
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        Gia_ManCollectAnds_rec(pGia,piVar3[lVar4],p_00);
      }
    }
    else if ((uVar1 & 3) == 2) {
      piVar3 = Vec_IntEntryP(vFadds,iObj * 5);
      for (lVar4 = 0; lVar4 != 2; lVar4 = lVar4 + 1) {
        Gia_ManCollectAnds_rec(pGia,piVar3[lVar4 + 3],p_00);
      }
    }
    else {
      Gia_ManCollectAnds_rec(pGia,iObj,p_00);
    }
  }
  iVar5 = 0;
  while (iVar5 < pGia->vCis->nSize) {
    iVar2 = Vec_IntEntry(pGia->vCis,iVar5);
    pObj = Gia_ManObj(pGia,iVar2);
    iVar2 = Gia_ObjId(pGia,pObj);
    if (iVar2 == 0) break;
    iVar5 = iVar5 + 1;
    Vec_IntWriteEntry(p_01,iVar2,iVar5);
  }
  for (iVar5 = 1; iVar5 + -1 < p_00->nSize; iVar5 = iVar5 + 1) {
    iVar2 = Vec_IntEntry(p_00,iVar5 + -1);
    Vec_IntWriteEntry(p_01,iVar2,pGia->vCis->nSize + iVar5);
  }
  Vec_IntFree(p);
  Vec_IntFree(vFadds);
  Vec_IntFree(vHadds);
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Gia_PolynReorder( Gia_Man_t * pGia, int fVerbose, int fVeryVerbose )
{
    Vec_Int_t * vFadds  = Gia_ManDetectFullAdders( pGia, fVeryVerbose, NULL );
    Vec_Int_t * vHadds  = Gia_ManDetectHalfAdders( pGia, fVeryVerbose );
    Vec_Int_t * vRecord = Gia_PolynFindOrder( pGia, vFadds, vHadds, fVerbose, fVeryVerbose );
    Vec_Int_t * vOrder  = Vec_IntAlloc( Gia_ManAndNum(pGia) );
    Vec_Int_t * vOrder2 = Vec_IntStart( Gia_ManObjNum(pGia) );
    int i, k, Entry;

    // collect nodes
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRecord, Entry, i )
    {
        int Node = Abc_Lit2Var2(Entry);
        int Attr = Abc_Lit2Att2(Entry);
        if ( Attr == 2 )
        {
            int * pFanins = Vec_IntEntryP( vFadds, 5*Node );
            for ( k = 3; k < 5; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else if ( Attr == 1 )
        {
            int * pFanins = Vec_IntEntryP( vHadds, 2*Node );
            for ( k = 0; k < 2; k++ )
                Gia_ManCollectAnds_rec( pGia, pFanins[k], vOrder );
        }
        else
            Gia_ManCollectAnds_rec( pGia, Node, vOrder );
        //printf( "Order = %d.  Node = %d.  Size = %d ", i, Node, Vec_IntSize(vOrder) );
    }
    //printf( "\n" );
    //assert( Vec_IntSize(vOrder) == Gia_ManAndNum(pGia) );

    // remap order
    Gia_ManForEachCiId( pGia, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+i );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_IntWriteEntry( vOrder2, Entry, 1+Gia_ManCiNum(pGia)+i );
    //Vec_IntPrint( vOrder );

    Vec_IntFree( vRecord );
    Vec_IntFree( vFadds );
    Vec_IntFree( vHadds );
    Vec_IntFree( vOrder );
    return vOrder2;
}